

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZManVector<TFad<6,_double>,_3>_>::Resize
          (TPZVec<TPZManVector<TFad<6,_double>,_3>_> *this,int64_t newsize,
          TPZManVector<TFad<6,_double>,_3> *object)

{
  undefined8 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int64_t *piVar4;
  ulong uVar5;
  int64_t *piVar6;
  long lVar7;
  long lVar8;
  TPZManVector<TFad<6,_double>,_3> *pTVar9;
  TPZManVector<TFad<6,_double>,_3> *pTVar10;
  long lVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar11 = this->fNElements;
  if (lVar11 != newsize) {
    if (newsize == 0) {
      pTVar10 = (TPZManVector<TFad<6,_double>,_3> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0xe0),8) == 0) {
        uVar5 = SUB168(auVar3 * ZEXT816(0xe0),0) | 8;
      }
      piVar4 = (int64_t *)operator_new__(uVar5);
      *piVar4 = newsize;
      pTVar10 = (TPZManVector<TFad<6,_double>,_3> *)(piVar4 + 1);
      lVar8 = 8;
      piVar6 = piVar4;
      do {
        *(undefined ***)((long)piVar4 + lVar8) = &PTR__TPZManVector_01877ba0;
        lVar7 = 0x30;
        do {
          *(undefined ***)((long)piVar6 + lVar7 + -8) = &PTR__TFad_01835938;
          *(undefined8 *)((long)piVar6 + lVar7) = 0;
          ((undefined8 *)((long)piVar6 + lVar7))[1] = 0;
          puVar1 = (undefined8 *)((long)piVar6 + lVar7 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)piVar6 + lVar7 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)piVar6 + lVar7 + 0x30) = 0;
          lVar7 = lVar7 + 0x40;
        } while (lVar7 != 0xf0);
        *(long *)((long)piVar4 + lVar8 + 8) = (long)piVar4 + lVar8 + 0x20;
        lVar7 = lVar8 + 0xe0;
        *(undefined8 *)((long)piVar4 + lVar8 + 0x10) = 0;
        *(undefined8 *)((long)piVar4 + lVar8 + 0x18) = 0;
        piVar6 = piVar6 + 0x1c;
        lVar8 = lVar8 + 0xe0;
      } while ((int64_t *)((long)piVar4 + lVar7) != piVar4 + newsize * 0x1c + 1);
    }
    if (newsize <= lVar11) {
      lVar11 = newsize;
    }
    if (lVar11 < 1) {
      lVar11 = 0;
    }
    else {
      lVar7 = 0;
      lVar8 = lVar11;
      do {
        TPZManVector<TFad<6,_double>,_3>::operator=
                  ((TPZManVector<TFad<6,_double>,_3> *)
                   ((long)pTVar10->fExtAlloc[0].dx_ + lVar7 + -0x30),
                   (TPZManVector<TFad<6,_double>,_3> *)
                   ((long)this->fStore->fExtAlloc[0].dx_ + lVar7 + -0x30));
        lVar7 = lVar7 + 0xe0;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    lVar8 = newsize - lVar11;
    if (lVar8 != 0 && lVar11 <= newsize) {
      pTVar9 = pTVar10 + lVar11;
      do {
        TPZManVector<TFad<6,_double>,_3>::operator=(pTVar9,object);
        pTVar9 = pTVar9 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pTVar9 = this->fStore;
    if (pTVar9 != (TPZManVector<TFad<6,_double>,_3> *)0x0) {
      dVar2 = pTVar9[-1].fExtAlloc[2].dx_[5];
      if (dVar2 != 0.0) {
        lVar11 = (long)dVar2 * 0xe0;
        do {
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_3> *)
                     ((long)pTVar9[-1].fExtAlloc[0].dx_ + lVar11 + -0x30));
          lVar11 = lVar11 + -0xe0;
        } while (lVar11 != 0);
      }
      operator_delete__(pTVar9[-1].fExtAlloc[2].dx_ + 5,(long)dVar2 * 0xe0 | 8);
    }
    this->fStore = pTVar10;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}